

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O1

int zddGroupSiftingBackward(DdManager *table,Move *moves,int size)

{
  Move **ppMVar1;
  DdSubtable *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Move *pMVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  pMVar11 = moves;
  if (moves != (Move *)0x0) {
    do {
      if (pMVar11->size < size) {
        size = pMVar11->size;
      }
      ppMVar1 = &pMVar11->next;
      pMVar11 = *ppMVar1;
    } while (*ppMVar1 != (Move *)0x0);
  }
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (moves->size == size) break;
    pDVar2 = table->subtableZ;
    uVar9 = moves->x;
    uVar12 = (ulong)uVar9;
    if ((pDVar2[uVar12].next == uVar9) && (uVar8 = moves->y, pDVar2[uVar8].next == uVar8)) {
      iVar4 = cuddZddSwapInPlace(table,uVar9,uVar8);
      if (iVar4 == 0) {
        return 0;
      }
    }
    else {
      uVar8 = moves->y;
      uVar10 = pDVar2[(int)uVar9].next;
      uVar6 = uVar8;
      do {
        uVar7 = uVar6;
        uVar6 = pDVar2[(int)uVar7].next;
      } while (uVar7 < pDVar2[(int)uVar7].next);
      iVar4 = uVar9 - uVar10;
      iVar13 = uVar7 - uVar8;
      if (-1 < iVar13) {
        uVar6 = uVar8;
        iVar3 = 1;
        do {
          iVar14 = (uVar9 - uVar10) + 1;
          if (-1 < iVar4) {
            do {
              uVar7 = (uint)uVar12;
              iVar5 = cuddZddSwapInPlace(table,uVar7,uVar6);
              if (iVar5 == 0) {
                return 0;
              }
              uVar6 = cuddZddNextLow(table,uVar7);
              uVar12 = (ulong)uVar6;
              iVar14 = iVar14 + -1;
              uVar6 = uVar7;
            } while (iVar14 != 0);
          }
          uVar6 = iVar3 + uVar8;
          uVar7 = cuddZddNextLow(table,uVar6);
          uVar12 = (ulong)uVar7;
          bVar15 = iVar3 != iVar13 + 1;
          iVar3 = iVar3 + 1;
        } while (bVar15);
      }
      uVar9 = uVar10;
      if (0 < iVar13) {
        do {
          uVar8 = cuddZddNextHigh(table,uVar9);
          table->subtableZ[(int)uVar9].next = uVar8;
          uVar9 = cuddZddNextHigh(table,uVar9);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      table->subtableZ[(int)uVar9].next = uVar10;
      uVar8 = cuddZddNextHigh(table,uVar9);
      uVar9 = uVar8;
      if (0 < iVar4) {
        do {
          uVar10 = cuddZddNextHigh(table,uVar9);
          table->subtableZ[(int)uVar9].next = uVar10;
          uVar9 = cuddZddNextHigh(table,uVar9);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      table->subtableZ[(int)uVar9].next = uVar8;
    }
    moves = moves->next;
  }
  return 1;
}

Assistant:

static int
zddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res;


    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if ((table->subtableZ[move->x].next == move->x) &&
        (table->subtableZ[move->y].next == move->y)) {
            res = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingBackward:\n");
            assert(table->subtableZ[move->x].next == move->x);
            assert(table->subtableZ[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = zddGroupMoveBackward(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}